

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_cxlgb(CPUS390XState_conflict *env,uint64_t v2,uint32_t m34)

{
  byte bVar1;
  _Bool XxC;
  int old_mode_00;
  float128 fVar2;
  uintptr_t unaff_retaddr;
  uint64_t local_30;
  float128 ret;
  int old_mode;
  uint32_t m34_local;
  uint64_t v2_local;
  CPUS390XState_conflict *env_local;
  
  bVar1 = round_from_m34(m34);
  old_mode_00 = s390_swap_bfp_rounding_mode(env,(uint)bVar1);
  fVar2 = uint64_to_float128_s390x(v2,&env->fpu_status);
  s390_restore_bfp_rounding_mode(env,old_mode_00);
  XxC = xxc_from_m34(m34);
  handle_exceptions(env,XxC,unaff_retaddr);
  local_30 = fVar2.low;
  env->retxl = local_30;
  ret.low = fVar2.high;
  return ret.low;
}

Assistant:

uint64_t HELPER(cxlgb)(CPUS390XState *env, uint64_t v2, uint32_t m34)
{
    int old_mode = s390_swap_bfp_rounding_mode(env, round_from_m34(m34));
    float128 ret = uint64_to_float128(v2, &env->fpu_status);

    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_exceptions(env, xxc_from_m34(m34), GETPC());
    return RET128(ret);
}